

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-105-verbose-combination-errors.cpp
# Opt level: O1

void anon_unknown.dwarf_2c3b3::verboseTest(string *first_combination,string *second_combination)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  MyErrorHandler *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  pointer pEVar13;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  initializer_list_t init_05;
  initializer_list_t init_06;
  initializer_list_t init_07;
  initializer_list_t init_08;
  initializer_list_t init_09;
  initializer_list_t init_10;
  initializer_list_t init_11;
  initializer_list_t init_12;
  initializer_list_t init_13;
  initializer_list_t init_14;
  MyErrorHandler error_handler_3;
  MyErrorHandler error_handler;
  json schema;
  undefined1 local_6e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6c8;
  undefined8 local_6c0;
  undefined1 local_6b0 [24];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_698;
  undefined8 local_688;
  undefined1 local_680 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  string local_640;
  string local_620;
  json local_600;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  generateSchema((anon_unknown_dwarf_2c3b3 *)&local_600,first_combination,second_combination);
  local_680._0_8_ = &PTR__MyErrorHandler_0016b160;
  local_680._8_8_ = (pointer)0x0;
  local_680._16_8_ = (pointer)0x0;
  local_680._24_8_ = (pointer)0x0;
  local_6e8._8_8_ = (object_t *)0x0;
  local_6e8[0] = 3;
  local_6e8._8_8_ =
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x1514b4);
  local_6e8._16_8_ = (value_type *)0x0;
  local_6b0._8_8_ = (object_t *)0x0;
  local_6b0[0] = 3;
  local_6b0._8_8_ =
       nlohmann::json_abi_v3_11_2::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,char_const(&)[7]>((char (*) [7])0x151525);
  local_6b0._16_8_ = (element_type *)0x0;
  local_698._0_8_ = local_698._0_8_ & 0xffffffffffffff00;
  local_698.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::detail::
  external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_698,1);
  local_688 = 0;
  init._M_len = 2;
  init._M_array = (iterator)local_6b0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_640,init,true,array);
  local_640.field_2._M_allocated_capacity = 0;
  init_00._M_len = 1;
  init_00._M_array = (iterator)&local_640;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)(local_6e8 + 0x18),init_00,true,array);
  local_6c0 = 0;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_6e8;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_660,init_01,true,array);
  local_650._M_allocated_capacity = 0;
  init_02._M_len = 1;
  init_02._M_array = (iterator)&local_660;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_620,init_02,true,array);
  validate(&local_600,(json *)&local_620,(error_handler *)local_680);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_620);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_660);
  lVar10 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(local_6e8 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_640);
  lVar10 = 0x18;
  do {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(local_6b0 + lVar10));
    uVar5 = local_680._8_8_;
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if (local_680._16_8_ - local_680._8_8_ == 0x1b0) {
    pcVar1 = local_6e8 + 0x10;
    local_6e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
    nlohmann::json_abi_v3_11_2::
    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_6b0,(string_t *)local_6e8);
    pbVar11 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
    pbVar9 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
    bVar6 = true;
    if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
      bVar6 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (pbVar11,pbVar9,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b0._0_8_);
      bVar6 = !bVar6;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6b0);
    if ((char *)local_6e8._0_8_ != pcVar1) {
      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
    }
    uVar5 = local_680._8_8_;
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                 ,0x80);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_680._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[0].ptr",0x13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
      local_6e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6b0,(string_t *)local_6e8);
      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_6b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    else {
      rootError((string *)&local_660,first_combination,3);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_660,
                 0x10);
      _Var2._M_current = (char *)(((_Rep_type *)uVar5)->_M_impl).super__Rb_tree_header._M_node_count
      ;
      local_6e8._16_8_ = (value_type *)0x0;
      local_6e8._24_8_ = 0;
      local_6e8._0_8_ = (char *)0x0;
      local_6e8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var2._M_current + *(size_type *)(uVar5 + 0x30)),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_6e8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0,0);
      if ((char *)local_6e8._0_8_ != (char *)0x0) {
        operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ - local_6e8._0_8_);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_allocated_capacity != &local_650) {
        operator_delete((void *)local_660._M_allocated_capacity,local_650._M_allocated_capacity + 1)
        ;
      }
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                   ,0x80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)(((_Rep_type *)local_680._8_8_)->_M_impl).
                                           super__Rb_tree_header._M_node_count,
                            *(size_type *)(local_680._8_8_ + 0x30));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" doesn\'t match with regex: \"",0x1d);
        rootError((string *)local_6e8,first_combination,3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((char *)local_6e8._0_8_ != pcVar1) {
          operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
        }
        (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
      }
      uVar5 = local_680._8_8_;
      local_6e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
      nlohmann::json_abi_v3_11_2::
      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6b0,(string_t *)local_6e8);
      pbVar11 = (((pointer)(uVar5 + 0x48))->ptr).reference_tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = *(pointer *)(uVar5 + 0x50);
      bVar6 = true;
      if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
        bVar6 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          (pbVar11,pbVar9,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6b0._0_8_);
        bVar6 = !bVar6;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b0);
      if ((char *)local_6e8._0_8_ != pcVar1) {
        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
      }
      uVar5 = local_680._8_8_;
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                   ,0x80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                           (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(local_680._8_8_ + 0x48));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[1].ptr",0x13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
        local_6e8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
        nlohmann::json_abi_v3_11_2::
        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b0,(string_t *)local_6e8);
        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                           (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_6b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      else {
        combinationError(&local_50,first_combination,0);
        rootError(&local_640,second_combination,2);
        operator<<((string *)&local_660,&local_50,&local_640);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_660,
                   0x10);
        _Var2._M_current = (((string *)(uVar5 + 0x70))->_M_dataplus)._M_p;
        local_6e8._16_8_ = (value_type *)0x0;
        local_6e8._24_8_ = 0;
        local_6e8._0_8_ = (char *)0x0;
        local_6e8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var2._M_current + *(size_type *)(uVar5 + 0x78)),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_6e8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0,0);
        if ((char *)local_6e8._0_8_ != (char *)0x0) {
          operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ - local_6e8._0_8_);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_allocated_capacity != &local_650) {
          operator_delete((void *)local_660._M_allocated_capacity,
                          local_650._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_640._M_dataplus._M_p != &local_640.field_2) {
          operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                     ,0x80);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)(((string *)(local_680._8_8_ + 0x70))->_M_dataplus).
                                             _M_p,*(size_type *)(local_680._8_8_ + 0x78));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" doesn\'t match with regex: \"",0x1d);
          combinationError(&local_70,first_combination,0);
          rootError((string *)local_6b0,second_combination,2);
          operator<<((string *)local_6e8,&local_70,(string *)local_6b0);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((char *)local_6e8._0_8_ != pcVar1) {
            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_6b0 + 0x10)) {
            operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
        }
        uVar5 = local_680._8_8_;
        local_6e8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
        nlohmann::json_abi_v3_11_2::
        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b0,(string_t *)local_6e8);
        pbVar11 = (((pointer)(uVar5 + 0x90))->ptr).reference_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar9 = *(pointer *)(uVar5 + 0x98);
        bVar6 = true;
        if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
          bVar6 = std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (pbVar11,pbVar9,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0._0_8_);
          bVar6 = !bVar6;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b0);
        if ((char *)local_6e8._0_8_ != pcVar1) {
          operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
        }
        uVar5 = local_680._8_8_;
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                     ,0x80);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                             (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_680._8_8_ + 0x90));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[2].ptr",0x13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
          local_6e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
          nlohmann::json_abi_v3_11_2::
          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b0,(string_t *)local_6e8);
          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                             (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_6b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        else {
          combinationError(&local_b0,first_combination,0);
          combinationError(&local_640,second_combination,0);
          operator<<(&local_90,&local_b0,&local_640);
          paVar12 = &local_620.field_2;
          local_620._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_620,"instance is below minimum of 5","");
          operator<<((string *)&local_660,&local_90,&local_620);
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_660
                     ,0x10);
          _Var2._M_current = (((string *)(uVar5 + 0xb8))->_M_dataplus)._M_p;
          local_6e8._16_8_ = (value_type *)0x0;
          local_6e8._24_8_ = 0;
          local_6e8._0_8_ = (char *)0x0;
          local_6e8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          bVar6 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + *(size_type *)(uVar5 + 0xc0)),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_6e8,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0,0);
          if ((char *)local_6e8._0_8_ != (char *)0x0) {
            operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ - local_6e8._0_8_);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_660._M_allocated_capacity != &local_650) {
            operator_delete((void *)local_660._M_allocated_capacity,
                            local_650._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_620._M_dataplus._M_p != paVar12) {
            operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_dataplus._M_p != &local_640.field_2) {
            operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (!bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                       ,0x80);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)(((string *)(local_680._8_8_ + 0xb8))->_M_dataplus).
                                               _M_p,*(size_type *)(local_680._8_8_ + 0xc0));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" doesn\'t match with regex: \"",0x1d);
            combinationError(&local_f0,first_combination,0);
            combinationError((string *)local_6b0,second_combination,0);
            operator<<(&local_d0,&local_f0,(string *)local_6b0);
            local_660._M_allocated_capacity = (size_type)&local_650;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_660,"instance is below minimum of 5","");
            operator<<((string *)local_6e8,&local_d0,(string *)&local_660);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if ((char *)local_6e8._0_8_ != pcVar1) {
              operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_660._M_allocated_capacity != &local_650) {
              operator_delete((void *)local_660._M_allocated_capacity,
                              local_650._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_6b0 + 0x10)) {
              operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
          }
          uVar5 = local_680._8_8_;
          local_6e8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
          nlohmann::json_abi_v3_11_2::
          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b0,(string_t *)local_6e8);
          pbVar11 = (((pointer)(uVar5 + 0xd8))->ptr).reference_tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar9 = *(pointer *)(uVar5 + 0xe0);
          bVar6 = true;
          if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
            bVar6 = std::__equal<false>::
                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                              (pbVar11,pbVar9,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6b0._0_8_);
            bVar6 = !bVar6;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6b0);
          if ((char *)local_6e8._0_8_ != pcVar1) {
            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
          }
          uVar5 = local_680._8_8_;
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                       ,0x80);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xce);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                               (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(local_680._8_8_ + 0xd8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[3].ptr",0x13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
            local_6e8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first/second","");
            nlohmann::json_abi_v3_11_2::
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6b0,(string_t *)local_6e8);
            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                               (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_6b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          else {
            combinationError(&local_130,first_combination,0);
            combinationError(&local_640,second_combination,1);
            operator<<(&local_110,&local_130,&local_640);
            local_620._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_620,"instance is not a multiple of 2.0","");
            operator<<((string *)&local_660,&local_110,&local_620);
            std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
            basic_regex<std::char_traits<char>,std::allocator<char>>
                      ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_660,0x10);
            _Var2._M_current = (((string *)(uVar5 + 0x100))->_M_dataplus)._M_p;
            local_6e8._16_8_ = (value_type *)0x0;
            local_6e8._24_8_ = 0;
            local_6e8._0_8_ = (char *)0x0;
            local_6e8._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            bVar6 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                              (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var2._M_current + *(size_type *)(uVar5 + 0x108)),
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_6e8,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0,0);
            if ((char *)local_6e8._0_8_ != (char *)0x0) {
              operator_delete((void *)local_6e8._0_8_,local_6e8._16_8_ - local_6e8._0_8_);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_660._M_allocated_capacity != &local_650) {
              operator_delete((void *)local_660._M_allocated_capacity,
                              local_650._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != paVar12) {
              operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_640._M_dataplus._M_p != &local_640.field_2) {
              operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                         ,0x80);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xcf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)(((string *)(local_680._8_8_ + 0x100))->_M_dataplus
                                                 )._M_p,*(size_type *)(local_680._8_8_ + 0x108));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" doesn\'t match with regex: \"",0x1d);
              combinationError(&local_170,first_combination,0);
              combinationError((string *)local_6b0,second_combination,1);
              operator<<(&local_150,&local_170,(string *)local_6b0);
              local_660._M_allocated_capacity = (size_type)&local_650;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_660,"instance is not a multiple of 2.0","");
              operator<<((string *)local_6e8,&local_150,(string *)&local_660);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
              std::endl<char,std::char_traits<char>>(poVar8);
              if ((char *)local_6e8._0_8_ != pcVar1) {
                operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_660._M_allocated_capacity != &local_650) {
                operator_delete((void *)local_660._M_allocated_capacity,
                                local_650._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_6b0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_6b0 + 0x10)) {
                operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
            }
            uVar5 = local_680._8_8_;
            local_6e8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
            nlohmann::json_abi_v3_11_2::
            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6b0,(string_t *)local_6e8);
            pbVar11 = (((pointer)(uVar5 + 0x120))->ptr).reference_tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar9 = *(pointer *)(uVar5 + 0x128);
            bVar6 = true;
            if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
              bVar6 = std::__equal<false>::
                      equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                (pbVar11,pbVar9,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6b0._0_8_);
              bVar6 = !bVar6;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6b0);
            if ((char *)local_6e8._0_8_ != pcVar1) {
              operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
            }
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                         ,0x80);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
              poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)(local_680._8_8_ + 0x120));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[4].ptr",0x13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
              local_6e8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
              nlohmann::json_abi_v3_11_2::
              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6b0,(string_t *)local_6e8);
              poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_6b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
              std::endl<char,std::char_traits<char>>(poVar8);
            }
            else {
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_680._8_8_ + 0x148);
              combinationError(&local_190,first_combination,1);
              local_660._M_allocated_capacity = (size_type)&local_650;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_660,"unexpected instance type","");
              operator<<((string *)local_6b0,&local_190,(string *)&local_660);
              std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
              basic_regex<std::char_traits<char>,std::allocator<char>>
                        ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b0,0x10);
              bVar6 = std::
                      regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         local_6e8,0);
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_6b0._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_6b0 + 0x10)) {
                operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_660._M_allocated_capacity != &local_650) {
                operator_delete((void *)local_660._M_allocated_capacity,
                                local_650._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if (!bVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                           ,0x80);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(char *)(((string *)(local_680._8_8_ + 0x148))->
                                                   _M_dataplus)._M_p,
                                    *(size_type *)(local_680._8_8_ + 0x150));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                combinationError(&local_1b0,first_combination,1);
                local_6b0._0_8_ = local_6b0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_6b0,"unexpected instance type","");
                operator<<((string *)local_6e8,&local_1b0,(string *)local_6b0);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                std::endl<char,std::char_traits<char>>(poVar8);
                if ((char *)local_6e8._0_8_ != pcVar1) {
                  operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_6b0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_6b0 + 0x10)) {
                  operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
              }
              uVar5 = local_680._8_8_;
              local_6e8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
              nlohmann::json_abi_v3_11_2::
              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6b0,(string_t *)local_6e8);
              pbVar11 = (((pointer)(uVar5 + 0x168))->ptr).reference_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar9 = *(pointer *)(uVar5 + 0x170);
              bVar6 = true;
              if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                bVar6 = std::__equal<false>::
                        equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                  (pbVar11,pbVar9,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_6b0._0_8_);
                bVar6 = !bVar6;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_6b0);
              if ((char *)local_6e8._0_8_ != pcVar1) {
                operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
              }
              if (!bVar6) {
                pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_680._8_8_ + 400);
                combinationError(&local_1d0,first_combination,2);
                local_660._M_allocated_capacity = (size_type)&local_650;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_660,"unexpected instance type","");
                operator<<((string *)local_6b0,&local_1d0,(string *)&local_660);
                std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                basic_regex<std::char_traits<char>,std::allocator<char>>
                          ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_6b0,0x10);
                bVar6 = std::
                        regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                  (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           local_6e8,0);
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_6b0._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_6b0 + 0x10)) {
                  operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_660._M_allocated_capacity != &local_650) {
                  operator_delete((void *)local_660._M_allocated_capacity,
                                  local_650._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                  operator_delete(local_1d0._M_dataplus._M_p,
                                  local_1d0.field_2._M_allocated_capacity + 1);
                }
                if (!bVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                             ,0x80);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)(((string *)(local_680._8_8_ + 400))->
                                                     _M_dataplus)._M_p,
                                      *(size_type *)(local_680._8_8_ + 0x198));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                  combinationError(&local_1f0,first_combination,2);
                  local_6b0._0_8_ = local_6b0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_6b0,"unexpected instance type","");
                  operator<<((string *)local_6e8,&local_1f0,(string *)local_6b0);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                }
                MyErrorHandler::~MyErrorHandler((MyErrorHandler *)local_680);
                local_680._0_8_ = &PTR__MyErrorHandler_0016b160;
                local_680._8_8_ = (pointer)0x0;
                local_680._16_8_ = (pointer)0x0;
                local_680._24_8_ = (pointer)0x0;
                local_6e8._8_8_ = (object_t *)0x0;
                local_6e8[0] = 3;
                local_6e8._8_8_ =
                     nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x1514b4);
                local_6e8._16_8_ = (value_type *)0x0;
                local_6b0._8_8_ = (object_t *)0x0;
                local_6b0[0] = 3;
                local_6b0._8_8_ =
                     nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::create<std::__cxx11::string,char_const(&)[7]>((char (*) [7])0x151525);
                local_6b0._16_8_ = (element_type *)0x0;
                local_698.m_value.object = (object_t *)0x0;
                local_698.m_type = 3;
                local_698.m_value.object =
                     (object_t *)
                     nlohmann::json_abi_v3_11_2::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::create<std::__cxx11::string,char_const(&)[15]>
                               ((char (*) [15])"not-an-integer");
                local_688 = 0;
                init_03._M_len = 2;
                init_03._M_array = (iterator)local_6b0;
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_640,init_03,true,array);
                local_640.field_2._M_allocated_capacity = 0;
                init_04._M_len = 1;
                init_04._M_array = (iterator)&local_640;
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)(local_6e8 + 0x18),init_04,true,array);
                local_6c0 = 0;
                init_05._M_len = 2;
                init_05._M_array = (iterator)local_6e8;
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_660,init_05,true,array);
                local_650._M_allocated_capacity = 0;
                init_06._M_len = 1;
                init_06._M_array = (iterator)&local_660;
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_620,init_06,true,array);
                validate(&local_600,(json *)&local_620,(error_handler *)local_680);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_620);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_660);
                lVar10 = 0x18;
                do {
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)(local_6e8 + lVar10));
                  lVar10 = lVar10 + -0x18;
                } while (lVar10 != -0x18);
                nlohmann::json_abi_v3_11_2::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)&local_640);
                lVar10 = 0x18;
                do {
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)(local_6b0 + lVar10));
                  uVar5 = local_680._8_8_;
                  lVar10 = lVar10 + -0x18;
                } while (lVar10 != -0x18);
                if (local_680._16_8_ - local_680._8_8_ == 0x1b0) {
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                    *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
                  pbVar9 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  uVar5 = local_680._8_8_;
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdf);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_680._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[0].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010df7d:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6b0);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    goto LAB_0010df9d;
                  }
                  rootError((string *)local_6b0,first_combination,3);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(((_Rep_type *)uVar5)->_M_impl).super__Rb_tree_header.
                                         _M_node_count,
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((_Rep_type *)local_680._8_8_)->_M_impl).
                                                       super__Rb_tree_header._M_node_count,
                                        *(size_type *)(local_680._8_8_ + 0x30));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    rootError((string *)local_6e8,first_combination,3);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  uVar5 = local_680._8_8_;
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_6e8,"/first/second","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((pointer)(uVar5 + 0x48))->ptr).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = *(pointer *)(uVar5 + 0x50);
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  uVar5 = local_680._8_8_;
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_680._8_8_ + 0x48));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[1].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_6e8,"/first/second","");
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010df7d;
                  }
                  combinationError(&local_210,first_combination,0);
                  rootError((string *)&local_660,second_combination,2);
                  operator<<((string *)local_6b0,&local_210,(string *)&local_660);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(uVar5 + 0x70),
                                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_660._M_allocated_capacity != &local_650) {
                    operator_delete((void *)local_660._M_allocated_capacity,
                                    local_650._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe3);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((string *)(local_680._8_8_ + 0x70))->
                                                       _M_dataplus)._M_p,
                                        *(size_type *)(local_680._8_8_ + 0x78));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    combinationError(&local_230,first_combination,0);
                    rootError((string *)local_6b0,second_combination,2);
                    operator<<((string *)local_6e8,&local_230,(string *)local_6b0);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_6b0 + 0x10)) {
                      operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != &local_230.field_2) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  uVar5 = local_680._8_8_;
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_6e8,"/first/second","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((pointer)(uVar5 + 0x90))->ptr).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = *(pointer *)(uVar5 + 0x98);
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_680._8_8_ + 0x90));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[2].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_6e8,"/first/second","");
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010df7d;
                  }
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_680._8_8_ + 0xb8);
                  combinationError(&local_270,first_combination,0);
                  combinationError((string *)&local_660,second_combination,0);
                  operator<<(&local_250,&local_270,(string *)&local_660);
                  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_640,"unexpected instance type","");
                  operator<<((string *)local_6b0,&local_250,&local_640);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_250._M_dataplus._M_p != &local_250.field_2) {
                    operator_delete(local_250._M_dataplus._M_p,
                                    local_250.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_660._M_allocated_capacity != &local_650) {
                    operator_delete((void *)local_660._M_allocated_capacity,
                                    local_650._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p != &local_270.field_2) {
                    operator_delete(local_270._M_dataplus._M_p,
                                    local_270.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((string *)(local_680._8_8_ + 0xb8))->
                                                       _M_dataplus)._M_p,
                                        *(size_type *)(local_680._8_8_ + 0xc0));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    combinationError(&local_2b0,first_combination,0);
                    combinationError((string *)local_6b0,second_combination,0);
                    operator<<(&local_290,&local_2b0,(string *)local_6b0);
                    local_660._M_allocated_capacity = (size_type)&local_650;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_660,"unexpected instance type","");
                    operator<<((string *)local_6e8,&local_290,(string *)&local_660);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_660._M_allocated_capacity != &local_650) {
                      operator_delete((void *)local_660._M_allocated_capacity,
                                      local_650._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290._M_dataplus._M_p != &local_290.field_2) {
                      operator_delete(local_290._M_dataplus._M_p,
                                      local_290.field_2._M_allocated_capacity + 1);
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_6b0 + 0x10)) {
                      operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                      operator_delete(local_2b0._M_dataplus._M_p,
                                      local_2b0.field_2._M_allocated_capacity + 1);
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  uVar5 = local_680._8_8_;
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_6e8,"/first/second","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((pointer)(uVar5 + 0xd8))->ptr).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = *(pointer *)(uVar5 + 0xe0);
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_680._8_8_ + 0xd8));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[3].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_6e8,"/first/second","");
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010df7d;
                  }
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_680._8_8_ + 0x100);
                  combinationError(&local_2f0,first_combination,0);
                  combinationError((string *)&local_660,second_combination,1);
                  operator<<(&local_2d0,&local_2f0,(string *)&local_660);
                  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_640,"unexpected instance type","");
                  operator<<((string *)local_6b0,&local_2d0,&local_640);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_660._M_allocated_capacity != &local_650) {
                    operator_delete((void *)local_660._M_allocated_capacity,
                                    local_650._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((string *)(local_680._8_8_ + 0x100))->
                                                       _M_dataplus)._M_p,
                                        *(size_type *)(local_680._8_8_ + 0x108));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    combinationError(&local_330,first_combination,0);
                    combinationError((string *)local_6b0,second_combination,1);
                    operator<<(&local_310,&local_330,(string *)local_6b0);
                    local_660._M_allocated_capacity = (size_type)&local_650;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_660,"unexpected instance type","");
                    operator<<((string *)local_6e8,&local_310,(string *)&local_660);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_660._M_allocated_capacity != &local_650) {
                      operator_delete((void *)local_660._M_allocated_capacity,
                                      local_650._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != &local_310.field_2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_6b0 + 0x10)) {
                      operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != &local_330.field_2) {
                      operator_delete(local_330._M_dataplus._M_p,
                                      local_330.field_2._M_allocated_capacity + 1);
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  uVar5 = local_680._8_8_;
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((pointer)(uVar5 + 0x120))->ptr).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = *(pointer *)(uVar5 + 0x128);
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xeb);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_680._8_8_ + 0x120));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[4].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010df7d;
                  }
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_680._8_8_ + 0x148);
                  combinationError(&local_350,first_combination,1);
                  local_660._M_allocated_capacity = (size_type)&local_650;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_660,"unexpected instance type","");
                  operator<<((string *)local_6b0,&local_350,(string *)&local_660);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_660._M_allocated_capacity != &local_650) {
                    operator_delete((void *)local_660._M_allocated_capacity,
                                    local_650._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p != &local_350.field_2) {
                    operator_delete(local_350._M_dataplus._M_p,
                                    local_350.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xec);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((string *)(local_680._8_8_ + 0x148))->
                                                       _M_dataplus)._M_p,
                                        *(size_type *)(local_680._8_8_ + 0x150));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    combinationError(&local_370,first_combination,1);
                    local_6b0._0_8_ = local_6b0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_6b0,"unexpected instance type","");
                    operator<<((string *)local_6e8,&local_370,(string *)local_6b0);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_6b0 + 0x10)) {
                      operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_370._M_dataplus._M_p != &local_370.field_2) {
                      operator_delete(local_370._M_dataplus._M_p,
                                      local_370.field_2._M_allocated_capacity + 1);
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  uVar5 = local_680._8_8_;
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_6b0,(string_t *)local_6e8);
                  pbVar11 = (((pointer)(uVar5 + 0x168))->ptr).reference_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = *(pointer *)(uVar5 + 0x170);
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xee);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)(local_680._8_8_ + 0x168));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[5].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010df7d;
                  }
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_680._8_8_ + 400);
                  combinationError(&local_390,first_combination,2);
                  local_660._M_allocated_capacity = (size_type)&local_650;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_660,"unexpected instance type","");
                  operator<<((string *)local_6b0,&local_390,(string *)&local_660);
                  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                  basic_regex<std::char_traits<char>,std::allocator<char>>
                            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6b0,0x10);
                  bVar6 = std::
                          regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                    (pbVar11,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )local_6e8,0);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_6b0._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_6b0 + 0x10)) {
                    operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_660._M_allocated_capacity != &local_650) {
                    operator_delete((void *)local_660._M_allocated_capacity,
                                    local_650._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_390._M_dataplus._M_p != &local_390.field_2) {
                    operator_delete(local_390._M_dataplus._M_p,
                                    local_390.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xef);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)(((string *)(local_680._8_8_ + 400))->
                                                       _M_dataplus)._M_p,
                                        *(size_type *)(local_680._8_8_ + 0x198));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                    combinationError(&local_3b0,first_combination,2);
                    local_6b0._0_8_ = local_6b0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_6b0,"unexpected instance type","");
                    operator<<((string *)local_6e8,&local_3b0,(string *)local_6b0);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_6b0._0_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_6b0 + 0x10)) {
                      operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                      operator_delete(local_3b0._M_dataplus._M_p,
                                      local_3b0.field_2._M_allocated_capacity + 1);
                    }
                    (anonymous_namespace)::g_error_count = (anonymous_namespace)::g_error_count + 1;
                  }
                  MyErrorHandler::~MyErrorHandler((MyErrorHandler *)local_680);
                  iVar7 = std::__cxx11::string::compare((char *)second_combination);
                  if (iVar7 == 0) {
                    local_680._0_8_ = &PTR__MyErrorHandler_0016b160;
                    local_680._8_8_ = (pointer)0x0;
                    local_680._16_8_ = (pointer)0x0;
                    local_680._24_8_ = (pointer)0x0;
                    local_6e8._8_8_ = (object_t *)0x0;
                    local_6e8[0] = 3;
                    local_6e8._8_8_ =
                         nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x1514b4);
                    local_6e8._16_8_ = (value_type *)0x0;
                    local_6b0._8_8_ = (object_t *)0x0;
                    local_6b0[0] = 3;
                    local_6b0._8_8_ =
                         nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::create<std::__cxx11::string,char_const(&)[7]>((char (*) [7])0x151525);
                    local_6b0._16_8_ = (element_type *)0x0;
                    local_698._0_8_ = local_698._0_8_ & 0xffffffffffffff00;
                    local_698.m_value.object = (object_t *)0x0;
                    nlohmann::json_abi_v3_11_2::detail::
                    external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
                    construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              (&local_698,8);
                    local_688 = 0;
                    init_09._M_len = 2;
                    init_09._M_array = (iterator)local_6b0;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_640,init_09,true,array);
                    local_640.field_2._M_allocated_capacity = 0;
                    init_10._M_len = 1;
                    init_10._M_array = (iterator)&local_640;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)(local_6e8 + 0x18),init_10,true,array);
                    local_6c0 = 0;
                    init_11._M_len = 2;
                    init_11._M_array = (iterator)local_6e8;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_660,init_11,true,array);
                    local_650._M_allocated_capacity = 0;
                    init_12._M_len = 1;
                    init_12._M_array = (iterator)&local_660;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_620,init_12,true,array);
                    validate(&local_600,(json *)&local_620,(error_handler *)local_680);
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&local_620);
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&local_660);
                    lVar10 = 0x18;
                    do {
                      nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)(local_6e8 + lVar10));
                      lVar10 = lVar10 + -0x18;
                    } while (lVar10 != -0x18);
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&local_640);
                    lVar10 = 0x18;
                    do {
                      nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)(local_6b0 + lVar10));
                      uVar5 = local_680._8_8_;
                      lVar10 = lVar10 + -0x18;
                    } while (lVar10 != -0x18);
                    if (local_680._16_8_ - local_680._8_8_ != 0x120) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf7);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"The two values of ",0x12);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (error_list.size()",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (4",3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,") should be equal",0x11);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      goto LAB_0010df9d;
                    }
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_6b0,(string_t *)local_6e8);
                    pbVar11 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                      *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_start;
                    pbVar9 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                     *)uVar5)->_M_impl)->_M_impl).super__Vector_impl_data._M_finish;
                    bVar6 = true;
                    if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                      bVar6 = std::__equal<false>::
                              equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                        (pbVar11,pbVar9,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_6b0._0_8_);
                      bVar6 = !bVar6;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6b0);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    uVar5 = local_680._8_8_;
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"The two values of ",0x12);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (error_list[0].ptr",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6b0,(string_t *)local_6e8);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,") should be equal",0x11);
                      std::endl<char,std::char_traits<char>>(poVar8);
                    }
                    else {
                      rootError((string *)local_6b0,first_combination,3);
                      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                      basic_regex<std::char_traits<char>,std::allocator<char>>
                                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_6b0,0x10);
                      bVar6 = std::
                              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(((_Rep_type *)uVar5)->_M_impl).super__Rb_tree_header.
                                             _M_node_count,
                                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         local_6e8,0);
                      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                      ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8
                                  );
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6b0._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_6b0 + 0x10)) {
                        operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                      }
                      if (!bVar6) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                   ,0x80);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,":",1);
                        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfa);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar8,(char *)(((_Rep_type *)local_680._8_8_)->_M_impl)
                                                           .super__Rb_tree_header._M_node_count,
                                            *(size_type *)(local_680._8_8_ + 0x30));
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                        rootError((string *)local_6e8,first_combination,3);
                        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                        std::endl<char,std::char_traits<char>>(poVar8);
                        if ((char *)local_6e8._0_8_ != pcVar1) {
                          operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                        }
                        (anonymous_namespace)::g_error_count =
                             (anonymous_namespace)::g_error_count + 1;
                      }
                      uVar5 = local_680._8_8_;
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first/second","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6b0,(string_t *)local_6e8);
                      pbVar11 = (((pointer)(uVar5 + 0x48))->ptr).reference_tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pbVar9 = *(pointer *)(uVar5 + 0x50);
                      bVar6 = true;
                      if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                        bVar6 = std::__equal<false>::
                                equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                          (pbVar11,pbVar9,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_6b0._0_8_);
                        bVar6 = !bVar6;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6b0);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      uVar5 = local_680._8_8_;
                      if (bVar6) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                   ,0x80);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,":",1);
                        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfc);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,"The two values of ",0x12);
                        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_680._8_8_ + 0x48));
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8," (error_list[1].ptr",0x13);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                        local_6e8._0_8_ = pcVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_6e8,"/first/second","");
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6b0,(string_t *)local_6e8);
                        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8," (nlohmann::json::json_pointer{\"/first/second\"}",0x2f);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,") should be equal",0x11);
                        std::endl<char,std::char_traits<char>>(poVar8);
                      }
                      else {
                        combinationError(&local_3d0,first_combination,0);
                        local_660._M_allocated_capacity = (size_type)&local_650;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_660,
                                   "more than one subschema has succeeded, but exactly one of them is required to validate"
                                   ,"");
                        operator<<((string *)local_6b0,&local_3d0,(string *)&local_660);
                        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                        basic_regex<std::char_traits<char>,std::allocator<char>>
                                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_6b0,0x10);
                        bVar6 = std::
                                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(uVar5 + 0x70),
                                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           local_6e8,0);
                        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                        ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_6e8);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_6b0._0_8_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_6b0 + 0x10)) {
                          operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_660._M_allocated_capacity != &local_650) {
                          operator_delete((void *)local_660._M_allocated_capacity,
                                          local_650._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                          operator_delete(local_3d0._M_dataplus._M_p,
                                          local_3d0.field_2._M_allocated_capacity + 1);
                        }
                        if (!bVar6) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                     ,0x80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,":",1);
                          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfd);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar8,(char *)(((string *)(local_680._8_8_ + 0x70))->
                                                             _M_dataplus)._M_p,
                                              *(size_type *)(local_680._8_8_ + 0x78));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                          combinationError(&local_3f0,first_combination,0);
                          local_6b0._0_8_ = local_6b0 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6b0,
                                     "more than one subschema has succeeded, but exactly one of them is required to validate"
                                     ,"");
                          operator<<((string *)local_6e8,&local_3f0,(string *)local_6b0);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                          std::endl<char,std::char_traits<char>>(poVar8);
                          if ((char *)local_6e8._0_8_ != pcVar1) {
                            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_6b0._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_6b0 + 0x10)) {
                            operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
                            operator_delete(local_3f0._M_dataplus._M_p,
                                            local_3f0.field_2._M_allocated_capacity + 1);
                          }
                          (anonymous_namespace)::g_error_count =
                               (anonymous_namespace)::g_error_count + 1;
                        }
                        uVar5 = local_680._8_8_;
                        local_6e8._0_8_ = pcVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_6e8,"/first","");
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6b0,(string_t *)local_6e8);
                        pbVar11 = (((pointer)(uVar5 + 0x90))->ptr).reference_tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pbVar9 = *(pointer *)(uVar5 + 0x98);
                        bVar6 = true;
                        if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                          bVar6 = std::__equal<false>::
                                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                            (pbVar11,pbVar9,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_6b0._0_8_);
                          bVar6 = !bVar6;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_6b0);
                        if ((char *)local_6e8._0_8_ != pcVar1) {
                          operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                        }
                        if (bVar6) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                     ,0x80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,":",1);
                          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xff);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,"The two values of ",0x12);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_680._8_8_ + 0x90));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (error_list[2].ptr",0x13);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                          local_6e8._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6e8,"/first","");
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_6b0,(string_t *)local_6e8);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,") should be equal",0x11);
                          std::endl<char,std::char_traits<char>>(poVar8);
                        }
                        else {
                          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_680._8_8_ + 0xb8);
                          combinationError(&local_410,first_combination,1);
                          local_660._M_allocated_capacity = (size_type)&local_650;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_660,"unexpected instance type","");
                          operator<<((string *)local_6b0,&local_410,(string *)&local_660);
                          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                          basic_regex<std::char_traits<char>,std::allocator<char>>
                                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8
                                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_6b0,0x10);
                          bVar6 = std::
                                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                            (pbVar11,(
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)local_6e8,0);
                          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                          ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_6e8);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_6b0._0_8_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_6b0 + 0x10)) {
                            operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_660._M_allocated_capacity != &local_650) {
                            operator_delete((void *)local_660._M_allocated_capacity,
                                            local_650._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_410._M_dataplus._M_p != &local_410.field_2) {
                            operator_delete(local_410._M_dataplus._M_p,
                                            local_410.field_2._M_allocated_capacity + 1);
                          }
                          if (!bVar6) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                       ,0x80);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,":",1);
                            poVar8 = (ostream *)
                                     std::ostream::operator<<((ostream *)&std::cerr,0x100);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8)
                            ;
                            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)(((string *)(local_680._8_8_ + 0xb8))
                                                               ->_M_dataplus)._M_p,
                                                *(size_type *)(local_680._8_8_ + 0xc0));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                            combinationError(&local_430,first_combination,1);
                            local_6b0._0_8_ = local_6b0 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_6b0,"unexpected instance type","");
                            operator<<((string *)local_6e8,&local_430,(string *)local_6b0);
                            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                            std::endl<char,std::char_traits<char>>(poVar8);
                            if ((char *)local_6e8._0_8_ != pcVar1) {
                              operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1))
                              ;
                            }
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_6b0._0_8_ !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_6b0 + 0x10)) {
                              operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1))
                              ;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
                              operator_delete(local_430._M_dataplus._M_p,
                                              local_430.field_2._M_allocated_capacity + 1);
                            }
                            (anonymous_namespace)::g_error_count =
                                 (anonymous_namespace)::g_error_count + 1;
                          }
                          uVar5 = local_680._8_8_;
                          local_6e8._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6e8,"/first","");
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_6b0,(string_t *)local_6e8);
                          pbVar11 = (((pointer)(uVar5 + 0xd8))->ptr).reference_tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pbVar9 = *(pointer *)(uVar5 + 0xe0);
                          bVar6 = true;
                          if ((long)pbVar9 - (long)pbVar11 == local_6b0._8_8_ - local_6b0._0_8_) {
                            bVar6 = std::__equal<false>::
                                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                              (pbVar11,pbVar9,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_6b0._0_8_);
                            bVar6 = !bVar6;
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_6b0);
                          if ((char *)local_6e8._0_8_ != pcVar1) {
                            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                          }
                          if (!bVar6) {
                            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(local_680._8_8_ + 0x100);
                            combinationError(&local_450,first_combination,2);
                            local_660._M_allocated_capacity = (size_type)&local_650;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_660,"unexpected instance type","");
                            operator<<((string *)local_6b0,&local_450,(string *)&local_660);
                            std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                            basic_regex<std::char_traits<char>,std::allocator<char>>
                                      ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                       local_6e8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6b0,0x10);
                            bVar6 = std::
                                    regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                              (pbVar11,(
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)local_6e8,0);
                            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                            ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         local_6e8);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_6b0._0_8_ !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(local_6b0 + 0x10)) {
                              operator_delete((void *)local_6b0._0_8_,(ulong)(local_6b0._16_8_ + 1))
                              ;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_660._M_allocated_capacity != &local_650) {
                              operator_delete((void *)local_660._M_allocated_capacity,
                                              local_650._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
                              operator_delete(local_450._M_dataplus._M_p,
                                              local_450.field_2._M_allocated_capacity + 1);
                            }
                            if (!bVar6) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                         ,0x80);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,":",1);
                              poVar8 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cerr,0x103);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar8,"String \"",8);
                              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar8,(char *)(((string *)
                                                                  (local_680._8_8_ + 0x100))->
                                                                 _M_dataplus)._M_p,
                                                  *(size_type *)(local_680._8_8_ + 0x108));
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                              combinationError(&local_470,first_combination,2);
                              local_6b0._0_8_ = local_6b0 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_6b0,"unexpected instance type","");
                              operator<<((string *)local_6e8,&local_470,(string *)local_6b0);
                              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                              std::endl<char,std::char_traits<char>>(poVar8);
                              if ((char *)local_6e8._0_8_ != pcVar1) {
                                operator_delete((void *)local_6e8._0_8_,
                                                (ulong)(local_6e8._16_8_ + 1));
                              }
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_6b0._0_8_ !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_6b0 + 0x10)) {
                                operator_delete((void *)local_6b0._0_8_,
                                                (ulong)(local_6b0._16_8_ + 1));
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_470._M_dataplus._M_p != &local_470.field_2) {
                                operator_delete(local_470._M_dataplus._M_p,
                                                local_470.field_2._M_allocated_capacity + 1);
                              }
                              (anonymous_namespace)::g_error_count =
                                   (anonymous_namespace)::g_error_count + 1;
                            }
                            MyErrorHandler::~MyErrorHandler((MyErrorHandler *)local_680);
                            goto LAB_0010e235;
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                     ,0x80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,":",1);
                          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x102);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,"The two values of ",0x12);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_680._8_8_ + 0xd8));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (error_list[3].ptr",0x13);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                          local_6e8._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6e8,"/first","");
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_6b0,(string_t *)local_6e8);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,") should be equal",0x11);
                          std::endl<char,std::char_traits<char>>(poVar8);
                        }
                      }
                    }
                    goto LAB_0010df7d;
                  }
LAB_0010e235:
                  local_6b0._0_8_ = &PTR__MyErrorHandler_0016b160;
                  local_6b0._8_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_6b0._16_8_ = (element_type *)0x0;
                  local_698._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_6e8._8_8_ = (object_t *)0x0;
                  local_6e8[0] = 3;
                  local_6e8._8_8_ =
                       nlohmann::json_abi_v3_11_2::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x1514b4);
                  local_6e8._16_8_ = (value_type *)0x0;
                  local_6e8._24_8_ = local_6e8._24_8_ & 0xffffffffffffff00;
                  local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  nlohmann::json_abi_v3_11_2::detail::
                  external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
                  construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)(local_6e8 + 0x18),10);
                  local_6c0 = 0;
                  init_07._M_len = 2;
                  init_07._M_array = (iterator)local_6e8;
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_680,init_07,true,array);
                  local_680._16_8_ = (pointer)0x0;
                  init_08._M_len = 1;
                  init_08._M_array = (iterator)local_680;
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_660,init_08,true,array);
                  validate(&local_600,(json *)&local_660,(error_handler *)local_6b0);
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&local_660);
                  nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)local_680);
                  lVar10 = 0x18;
                  do {
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)(local_6e8 + lVar10));
                    uVar5 = local_6b0._8_8_;
                    lVar10 = lVar10 + -0x18;
                  } while (lVar10 != -0x18);
                  if (local_6b0._16_8_ - local_6b0._8_8_ != 0x120) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list.size()",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (4",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    goto LAB_0010fbc5;
                  }
                  local_6e8._0_8_ = pcVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
                  nlohmann::json_abi_v3_11_2::
                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_680,(string_t *)local_6e8);
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)uVar5)->_M_impl).super__Vector_impl_data._M_start;
                  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)uVar5)->_M_impl).super__Vector_impl_data._M_finish;
                  bVar6 = true;
                  if ((long)pbVar9 - (long)pbVar11 == local_680._8_8_ - local_680._0_8_) {
                    bVar6 = std::__equal<false>::
                            equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                      (pbVar11,pbVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_680._0_8_);
                    bVar6 = !bVar6;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_680);
                  if ((char *)local_6e8._0_8_ != pcVar1) {
                    operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                  }
                  uVar5 = local_6b0._8_8_;
                  if (bVar6) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10d);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list[0].ptr",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_680,(string_t *)local_6e8);
                    poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                       (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_680);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010fba5:
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                  }
                  else {
                    rootError((string *)local_680,first_combination,3);
                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                    basic_regex<std::char_traits<char>,std::allocator<char>>
                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_680,0x10);
                    bVar6 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&(((_Rep_type *)uVar5)->_M_impl).super__Rb_tree_header.
                                           _M_node_count,
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_6e8,0);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_680 + 0x10);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_680._0_8_ != pbVar11) {
                      operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                    }
                    if (!bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x10e);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)(((_Rep_type *)local_6b0._8_8_)->_M_impl).
                                                         super__Rb_tree_header._M_node_count,
                                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                            *)(local_6b0._8_8_ + 0x30))->_M_allocated_capacity);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                      rootError((string *)local_6e8,first_combination,3);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      (anonymous_namespace)::g_error_count =
                           (anonymous_namespace)::g_error_count + 1;
                    }
                    uVar5 = local_6b0._8_8_;
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_680,(string_t *)local_6e8);
                    pbVar9 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (uVar5 + 0x48);
                    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar5 + 0x50))->_M_allocated_capacity;
                    bVar6 = true;
                    if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                      bVar6 = std::__equal<false>::
                              equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                        (pbVar9,pbVar4,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_680._0_8_);
                      bVar6 = !bVar6;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    uVar5 = local_6b0._8_8_;
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"The two values of ",0x12);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0x48));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (error_list[1].ptr",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680,(string_t *)local_6e8);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,") should be equal",0x11);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      goto LAB_0010fba5;
                    }
                    combinationError(&local_490,first_combination,0);
                    local_660._M_allocated_capacity = (size_type)&local_650;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_660,"unexpected instance type","");
                    operator<<((string *)local_680,&local_490,(string *)&local_660);
                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                    basic_regex<std::char_traits<char>,std::allocator<char>>
                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_680,0x10);
                    bVar6 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(uVar5 + 0x70),
                                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_6e8,0);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_680._0_8_ != pbVar11) {
                      operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_660._M_allocated_capacity != &local_650) {
                      operator_delete((void *)local_660._M_allocated_capacity,
                                      local_650._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_490._M_dataplus._M_p != &local_490.field_2) {
                      operator_delete(local_490._M_dataplus._M_p,
                                      local_490.field_2._M_allocated_capacity + 1);
                    }
                    if (!bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(local_6b0._8_8_ + 0x70))->_M_allocated_capacity
                                          ,*(long *)(local_6b0._8_8_ + 0x78));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                      combinationError(&local_4b0,first_combination,0);
                      local_680._0_8_ = pbVar11;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_680,"unexpected instance type","");
                      operator<<((string *)local_6e8,&local_4b0,(string *)local_680);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_680._0_8_ != pbVar11) {
                        operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                        operator_delete(local_4b0._M_dataplus._M_p,
                                        local_4b0.field_2._M_allocated_capacity + 1);
                      }
                      (anonymous_namespace)::g_error_count =
                           (anonymous_namespace)::g_error_count + 1;
                    }
                    uVar5 = local_6b0._8_8_;
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_680,(string_t *)local_6e8);
                    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(uVar5 + 0x90))->_M_allocated_capacity;
                    pbVar4 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (uVar5 + 0x98);
                    bVar6 = true;
                    if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                      bVar6 = std::__equal<false>::
                              equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                        (pbVar9,pbVar4,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_680._0_8_);
                      bVar6 = !bVar6;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x113);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"The two values of ",0x12);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0x90));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (error_list[2].ptr",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680,(string_t *)local_6e8);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,") should be equal",0x11);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      goto LAB_0010fba5;
                    }
                    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6b0._8_8_ + 0xb8);
                    combinationError(&local_4d0,first_combination,1);
                    local_660._M_allocated_capacity = (size_type)&local_650;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_660,"instance is below minimum of 20","");
                    operator<<((string *)local_680,&local_4d0,(string *)&local_660);
                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                    basic_regex<std::char_traits<char>,std::allocator<char>>
                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_680,0x10);
                    bVar6 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      (pbVar9,(basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                               *)local_6e8,0);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_680._0_8_ != pbVar11) {
                      operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_660._M_allocated_capacity != &local_650) {
                      operator_delete((void *)local_660._M_allocated_capacity,
                                      local_650._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                      operator_delete(local_4d0._M_dataplus._M_p,
                                      local_4d0.field_2._M_allocated_capacity + 1);
                    }
                    if (!bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x114);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,*(char **)(local_6b0._8_8_ + 0xb8),
                                          (long)(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_6b0._8_8_ + 0xc0))->_M_dataplus)._M_p);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                      combinationError(&local_4f0,first_combination,1);
                      local_680._0_8_ = pbVar11;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_680,"instance is below minimum of 20","");
                      operator<<((string *)local_6e8,&local_4f0,(string *)local_680);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_680._0_8_ != pbVar11) {
                        operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                        operator_delete(local_4f0._M_dataplus._M_p,
                                        local_4f0.field_2._M_allocated_capacity + 1);
                      }
                      (anonymous_namespace)::g_error_count =
                           (anonymous_namespace)::g_error_count + 1;
                    }
                    uVar5 = local_6b0._8_8_;
                    local_6e8._0_8_ = pcVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","")
                    ;
                    nlohmann::json_abi_v3_11_2::
                    json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_680,(string_t *)local_6e8);
                    pbVar9 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (uVar5 + 0xd8);
                    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (uVar5 + 0xe0))->_M_dataplus)._M_p;
                    bVar6 = true;
                    if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                      bVar6 = std::__equal<false>::
                              equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                        (pbVar9,pbVar4,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_680._0_8_);
                      bVar6 = !bVar6;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680);
                    if ((char *)local_6e8._0_8_ != pcVar1) {
                      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                    }
                    if (bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x116);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"The two values of ",0x12);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0xd8));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (error_list[3].ptr",0x13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680,(string_t *)local_6e8);
                      poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                         (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,") should be equal",0x11);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      goto LAB_0010fba5;
                    }
                    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_6b0._8_8_ + 0x100);
                    combinationError(&local_510,first_combination,2);
                    local_660._M_allocated_capacity = (size_type)&local_650;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_660,"unexpected instance type","");
                    operator<<((string *)local_680,&local_510,(string *)&local_660);
                    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                    basic_regex<std::char_traits<char>,std::allocator<char>>
                              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_680,0x10);
                    bVar6 = std::
                            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                      (pbVar9,(basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                               *)local_6e8,0);
                    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_6e8);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_680._0_8_ != pbVar11) {
                      operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_660._M_allocated_capacity != &local_650) {
                      operator_delete((void *)local_660._M_allocated_capacity,
                                      local_650._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p,
                                      local_510.field_2._M_allocated_capacity + 1);
                    }
                    if (!bVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                 ,0x80);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,":",1);
                      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x117);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_6b0._8_8_ + 0x100))->_M_dataplus)._M_p,
                                          *(size_type *)(local_6b0._8_8_ + 0x108));
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                      combinationError(&local_530,first_combination,2);
                      local_680._0_8_ = pbVar11;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_680,"unexpected instance type","");
                      operator<<((string *)local_6e8,&local_530,(string *)local_680);
                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_680._0_8_ != pbVar11) {
                        operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_530._M_dataplus._M_p != &local_530.field_2) {
                        operator_delete(local_530._M_dataplus._M_p,
                                        local_530.field_2._M_allocated_capacity + 1);
                      }
                      (anonymous_namespace)::g_error_count =
                           (anonymous_namespace)::g_error_count + 1;
                    }
                    MyErrorHandler::~MyErrorHandler((MyErrorHandler *)local_6b0);
                    local_6b0._0_8_ = &PTR__MyErrorHandler_0016b160;
                    local_6b0._8_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_6b0._16_8_ = (element_type *)0x0;
                    local_698._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_6e8._8_8_ = (object_t *)0x0;
                    local_6e8[0] = 3;
                    local_6e8._8_8_ =
                         nlohmann::json_abi_v3_11_2::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x1514b4);
                    local_6e8._16_8_ = (value_type *)0x0;
                    local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    local_6e8[0x18] = 3;
                    local_6c8 = nlohmann::json_abi_v3_11_2::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ::create<std::__cxx11::string,char_const(&)[6]>
                                          ((char (*) [6])"short");
                    local_6c0 = 0;
                    init_13._M_len = 2;
                    init_13._M_array = (iterator)local_6e8;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_680,init_13,true,array);
                    local_680._16_8_ = (pointer)0x0;
                    init_14._M_len = 1;
                    init_14._M_array = (iterator)local_680;
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&local_660,init_14,true,array);
                    validate(&local_600,(json *)&local_660,(error_handler *)local_6b0);
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&local_660);
                    nlohmann::json_abi_v3_11_2::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)local_680);
                    lVar10 = 0x18;
                    do {
                      nlohmann::json_abi_v3_11_2::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)(local_6e8 + lVar10));
                      uVar5 = local_6b0._8_8_;
                      lVar10 = lVar10 + -0x18;
                    } while (lVar10 != -0x18);
                    if (local_6b0._16_8_ - local_6b0._8_8_ == 0x120) {
                      local_6e8._0_8_ = pcVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_6e8,"/first","");
                      nlohmann::json_abi_v3_11_2::
                      json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_680,(string_t *)local_6e8);
                      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  *)uVar5)->_M_impl).super__Vector_impl_data._M_start;
                      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  *)uVar5)->_M_impl).super__Vector_impl_data._M_finish;
                      bVar6 = true;
                      if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                        bVar6 = std::__equal<false>::
                                equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                          (pbVar9,pbVar4,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_680._0_8_);
                        bVar6 = !bVar6;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_680);
                      if ((char *)local_6e8._0_8_ != pcVar1) {
                        operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                      }
                      uVar5 = local_6b0._8_8_;
                      if (bVar6) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                   ,0x80);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,":",1);
                        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x121);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,"The two values of ",0x12);
                        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0._8_8_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8," (error_list[0].ptr",0x13);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                        local_6e8._0_8_ = pcVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_6e8,"/first","");
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_680,(string_t *)local_6e8);
                        poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                           (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8,") should be equal",0x11);
                        std::endl<char,std::char_traits<char>>(poVar8);
                      }
                      else {
                        rootError((string *)local_680,first_combination,3);
                        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                        basic_regex<std::char_traits<char>,std::allocator<char>>
                                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_680,0x10);
                        bVar6 = std::
                                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&(((_Rep_type *)uVar5)->_M_impl).super__Rb_tree_header
                                               ._M_node_count,
                                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           local_6e8,0);
                        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                        ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                     local_6e8);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_680._0_8_ != pbVar11) {
                          operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                        }
                        if (!bVar6) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                     ,0x80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,":",1);
                          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x122);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar8,(char *)(((_Rep_type *)local_6b0._8_8_)->
                                                             _M_impl).super__Rb_tree_header.
                                                             _M_node_count,
                                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                *)(local_6b0._8_8_ + 0x30))->_M_allocated_capacity);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                          rootError((string *)local_6e8,first_combination,3);
                          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                          std::endl<char,std::char_traits<char>>(poVar8);
                          if ((char *)local_6e8._0_8_ != pcVar1) {
                            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                          }
                          (anonymous_namespace)::g_error_count =
                               (anonymous_namespace)::g_error_count + 1;
                        }
                        uVar5 = local_6b0._8_8_;
                        local_6e8._0_8_ = pcVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_6e8,"/first","");
                        nlohmann::json_abi_v3_11_2::
                        json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_680,(string_t *)local_6e8);
                        pbVar9 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(uVar5 + 0x48);
                        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)(uVar5 + 0x50))->_M_allocated_capacity;
                        bVar6 = true;
                        if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                          bVar6 = std::__equal<false>::
                                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                            (pbVar9,pbVar4,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_680._0_8_);
                          bVar6 = !bVar6;
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_680);
                        if ((char *)local_6e8._0_8_ != pcVar1) {
                          operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                        }
                        uVar5 = local_6b0._8_8_;
                        if (bVar6) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                     ,0x80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,":",1);
                          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x124);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,"The two values of ",0x12);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0x48));
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (error_list[1].ptr",0x13);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                          local_6e8._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6e8,"/first","");
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_680,(string_t *)local_6e8);
                          poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                             (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar8,") should be equal",0x11);
                          std::endl<char,std::char_traits<char>>(poVar8);
                        }
                        else {
                          combinationError(&local_550,first_combination,0);
                          local_660._M_allocated_capacity = (size_type)&local_650;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_660,"unexpected instance type","");
                          operator<<((string *)local_680,&local_550,(string *)&local_660);
                          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                          basic_regex<std::char_traits<char>,std::allocator<char>>
                                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_6e8
                                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_680,0x10);
                          bVar6 = std::
                                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(uVar5 + 0x70),
                                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *
                                             )local_6e8,0);
                          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                          ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                       local_6e8);
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_680._0_8_ != pbVar11) {
                            operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_660._M_allocated_capacity != &local_650) {
                            operator_delete((void *)local_660._M_allocated_capacity,
                                            local_650._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_550._M_dataplus._M_p != &local_550.field_2) {
                            operator_delete(local_550._M_dataplus._M_p,
                                            local_550.field_2._M_allocated_capacity + 1);
                          }
                          if (!bVar6) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                       ,0x80);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,":",1);
                            poVar8 = (ostream *)
                                     std::ostream::operator<<((ostream *)&std::cerr,0x125);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"String \"",8)
                            ;
                            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(local_6b0._8_8_ + 0x70))->_M_allocated_capacity
                                                ,*(long *)(local_6b0._8_8_ + 0x78));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                            combinationError(&local_570,first_combination,0);
                            local_680._0_8_ = pbVar11;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_680,"unexpected instance type","");
                            operator<<((string *)local_6e8,&local_570,(string *)local_680);
                            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                               (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                            std::endl<char,std::char_traits<char>>(poVar8);
                            if ((char *)local_6e8._0_8_ != pcVar1) {
                              operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1))
                              ;
                            }
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_680._0_8_ != pbVar11) {
                              operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1))
                              ;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_570._M_dataplus._M_p != &local_570.field_2) {
                              operator_delete(local_570._M_dataplus._M_p,
                                              local_570.field_2._M_allocated_capacity + 1);
                            }
                            (anonymous_namespace)::g_error_count =
                                 (anonymous_namespace)::g_error_count + 1;
                          }
                          uVar5 = local_6b0._8_8_;
                          local_6e8._0_8_ = pcVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_6e8,"/first","");
                          nlohmann::json_abi_v3_11_2::
                          json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_680,(string_t *)local_6e8);
                          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)(uVar5 + 0x90))->_M_allocated_capacity;
                          pbVar4 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(uVar5 + 0x98);
                          bVar6 = true;
                          if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                            bVar6 = std::__equal<false>::
                                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                              (pbVar9,pbVar4,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_680._0_8_);
                            bVar6 = !bVar6;
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_680);
                          if ((char *)local_6e8._0_8_ != pcVar1) {
                            operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
                          }
                          if (bVar6) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                       ,0x80);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,":",1);
                            poVar8 = (ostream *)
                                     std::ostream::operator<<((ostream *)&std::cerr,0x127);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"The two values of ",0x12);
                            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0x90));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8," (error_list[2].ptr",0x13);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                            local_6e8._0_8_ = pcVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_6e8,"/first","");
                            nlohmann::json_abi_v3_11_2::
                            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_680,(string_t *)local_6e8);
                            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,") should be equal",0x11);
                            std::endl<char,std::char_traits<char>>(poVar8);
                          }
                          else {
                            pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_6b0._8_8_ + 0xb8);
                            combinationError(&local_590,first_combination,1);
                            local_660._M_allocated_capacity = (size_type)&local_650;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_660,"unexpected instance type","");
                            operator<<((string *)local_680,&local_590,(string *)&local_660);
                            std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                            basic_regex<std::char_traits<char>,std::allocator<char>>
                                      ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                       local_6e8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_680,0x10);
                            bVar6 = std::
                                    regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                              (pbVar9,(
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)local_6e8,0);
                            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                            ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                         local_6e8);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_680._0_8_ != pbVar11) {
                              operator_delete((void *)local_680._0_8_,(ulong)(local_680._16_8_ + 1))
                              ;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_660._M_allocated_capacity != &local_650) {
                              operator_delete((void *)local_660._M_allocated_capacity,
                                              local_650._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
                              operator_delete(local_590._M_dataplus._M_p,
                                              local_590.field_2._M_allocated_capacity + 1);
                            }
                            if (!bVar6) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,
                                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                         ,0x80);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,":",1);
                              poVar8 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cerr,0x128);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar8,"String \"",8);
                              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar8,*(char **)(local_6b0._8_8_ + 0xb8),
                                                  (long)(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_6b0._8_8_ + 0xc0))->_M_dataplus)._M_p);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                              combinationError(&local_5b0,first_combination,1);
                              local_680._0_8_ = pbVar11;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_680,"unexpected instance type","");
                              operator<<((string *)local_6e8,&local_5b0,(string *)local_680);
                              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                 (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                              std::endl<char,std::char_traits<char>>(poVar8);
                              if ((char *)local_6e8._0_8_ != pcVar1) {
                                operator_delete((void *)local_6e8._0_8_,
                                                (ulong)(local_6e8._16_8_ + 1));
                              }
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_680._0_8_ != pbVar11) {
                                operator_delete((void *)local_680._0_8_,
                                                (ulong)(local_680._16_8_ + 1));
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
                                operator_delete(local_5b0._M_dataplus._M_p,
                                                local_5b0.field_2._M_allocated_capacity + 1);
                              }
                              (anonymous_namespace)::g_error_count =
                                   (anonymous_namespace)::g_error_count + 1;
                            }
                            uVar5 = local_6b0._8_8_;
                            local_6e8._0_8_ = pcVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_6e8,"/first","");
                            nlohmann::json_abi_v3_11_2::
                            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_680,(string_t *)local_6e8);
                            pbVar9 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       **)(uVar5 + 0xd8);
                            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(uVar5 + 0xe0))->_M_dataplus)._M_p;
                            bVar6 = true;
                            if ((long)pbVar4 - (long)pbVar9 == local_680._8_8_ - local_680._0_8_) {
                              bVar6 = std::__equal<false>::
                                      equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                                (pbVar9,pbVar4,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_680._0_8_);
                              bVar6 = !bVar6;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_680);
                            if ((char *)local_6e8._0_8_ != pcVar1) {
                              operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1))
                              ;
                            }
                            if (!bVar6) {
                              pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_6b0._8_8_ + 0x100);
                              combinationError(&local_5d0,first_combination,2);
                              local_660._M_allocated_capacity = (size_type)&local_650;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_660,
                                         "instance is too short as per minLength:10","");
                              operator<<((string *)local_680,&local_5d0,(string *)&local_660);
                              std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
                              basic_regex<std::char_traits<char>,std::allocator<char>>
                                        ((basic_regex<char,std::__cxx11::regex_traits<char>> *)
                                         local_6e8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_680,0x10);
                              bVar6 = std::
                                      regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                (pbVar9,(
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  *)local_6e8,0);
                              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                              ~basic_regex((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                           local_6e8);
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_680._0_8_ != pbVar11) {
                                operator_delete((void *)local_680._0_8_,
                                                (ulong)(local_680._16_8_ + 1));
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_660._M_allocated_capacity != &local_650) {
                                operator_delete((void *)local_660._M_allocated_capacity,
                                                local_650._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
                                operator_delete(local_5d0._M_dataplus._M_p,
                                                local_5d0.field_2._M_allocated_capacity + 1);
                              }
                              if (!bVar6) {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,
                                           "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                           ,0x80);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,":",1);
                                poVar8 = (ostream *)
                                         std::ostream::operator<<((ostream *)&std::cerr,299);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar8,"String \"",8);
                                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                   (poVar8,(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(local_6b0._8_8_ + 0x100))->_M_dataplus)._M_p,
                                                  *(size_type *)(local_6b0._8_8_ + 0x108));
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar8,"\" doesn\'t match with regex: \"",0x1d);
                                combinationError(&local_5f0,first_combination,2);
                                local_680._0_8_ = pbVar11;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_680,
                                           "instance is too short as per minLength:10","");
                                operator<<((string *)local_6e8,&local_5f0,(string *)local_680);
                                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                   (poVar8,(char *)local_6e8._0_8_,local_6e8._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
                                std::endl<char,std::char_traits<char>>(poVar8);
                                if ((char *)local_6e8._0_8_ != pcVar1) {
                                  operator_delete((void *)local_6e8._0_8_,
                                                  (ulong)(local_6e8._16_8_ + 1));
                                }
                                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_680._0_8_ != pbVar11) {
                                  operator_delete((void *)local_680._0_8_,
                                                  (ulong)(local_680._16_8_ + 1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
                                  operator_delete(local_5f0._M_dataplus._M_p,
                                                  local_5f0.field_2._M_allocated_capacity + 1);
                                }
                                (anonymous_namespace)::g_error_count =
                                     (anonymous_namespace)::g_error_count + 1;
                              }
                              goto LAB_0010fbc5;
                            }
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                                       ,0x80);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,":",1);
                            poVar8 = (ostream *)
                                     std::ostream::operator<<((ostream *)&std::cerr,0x12a);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"The two values of ",0x12);
                            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(local_6b0._8_8_ + 0xd8));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8," (error_list[3].ptr",0x13);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                            local_6e8._0_8_ = pcVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_6e8,"/first","");
                            nlohmann::json_abi_v3_11_2::
                            json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_680,(string_t *)local_6e8);
                            poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                               (poVar8,(
                                                  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_680);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,") should be equal",0x11);
                            std::endl<char,std::char_traits<char>>(poVar8);
                          }
                        }
                      }
                      goto LAB_0010fba5;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                               ,0x80);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11f);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,"The two values of ",0x12);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8," (error_list.size()",0x13);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (4",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,") should be equal",0x11);
                    std::endl<char,std::char_traits<char>>(poVar8);
                  }
LAB_0010fbc5:
                  this = (MyErrorHandler *)local_6b0;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                             ,0x80);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdd);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,"The two values of ",0x12);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," (error_list.size()",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (6",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,") should be equal",0x11);
                  std::endl<char,std::char_traits<char>>(poVar8);
LAB_0010df9d:
                  this = (MyErrorHandler *)local_680;
                }
                MyErrorHandler::~MyErrorHandler(this);
                goto LAB_0010c410;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
                         ,0x80);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
              poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)(local_680._8_8_ + 0x168));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list[5].ptr",0x13);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
              local_6e8._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"/first","");
              nlohmann::json_abi_v3_11_2::
              json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6b0,(string_t *)local_6e8);
              poVar8 = nlohmann::json_abi_v3_11_2::operator<<
                                 (poVar8,(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_6b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," (nlohmann::json::json_pointer{\"/first\"}",0x28);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
              std::endl<char,std::char_traits<char>>(poVar8);
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6b0);
    if ((char *)local_6e8._0_8_ != pcVar1) {
      operator_delete((void *)local_6e8._0_8_,(ulong)(local_6e8._16_8_ + 1));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/pboettch[P]json-schema-validator/test/issue-105-verbose-combination-errors.cpp"
               ,0x80);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"The two values of ",0x12);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (error_list.size()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (6",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") should be equal",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  uVar5 = local_680._16_8_;
  local_680._0_8_ = &PTR__MyErrorHandler_0016b160;
  if (local_680._8_8_ != local_680._16_8_) {
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_680._8_8_ + 0x38);
    do {
      plVar3 = (long *)(((string *)(paVar12 + -1))->_M_dataplus)._M_p;
      if (paVar12 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar3) {
        operator_delete(plVar3,(ulong)((long)&(((pointer)paVar12->_M_allocated_capacity)->
                                              _M_dataplus)._M_p + 1));
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(paVar12 + -2));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)paVar12 + -0x38));
      pEVar13 = (pointer)(paVar12 + 1);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar12 + 0x48);
    } while (pEVar13 != (pointer)uVar5);
  }
  if ((pointer)local_680._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_680._8_8_,local_680._24_8_ - local_680._8_8_);
  }
LAB_0010c410:
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_600);
  return;
}

Assistant:

auto verboseTest(const std::string &first_combination, const std::string &second_combination) -> void
{
	const nlohmann::json schema = generateSchema(first_combination, second_combination);

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", 1}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 6);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << rootError(second_combination, 2));

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 0) << combinationError(second_combination, 0) << "instance is below minimum of 5");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 0) << combinationError(second_combination, 1) << "instance is not a multiple of 2.0");

		EXPECT_EQ(error_list[4].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[4].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[5].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[5].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", "not-an-integer"}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 6);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << rootError(second_combination, 2));

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 0) << combinationError(second_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 0) << combinationError(second_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[4].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[4].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[5].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[5].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	if (second_combination == "oneOf") {
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", {{"second", 8}}}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first/second"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "more than one subschema has succeeded, but exactly one of them is required to validate");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", 10}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "instance is below minimum of 20");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "unexpected instance type");
	}

	{
		MyErrorHandler error_handler;
		validate(schema, nlohmann::json{{"first", "short"}}, &error_handler);

		const MyErrorHandler::ErrorEntryList &error_list = error_handler.getErrors();
		EXPECT_EQ(error_list.size(), 4);

		EXPECT_EQ(error_list[0].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[0].message, rootError(first_combination, 3));

		EXPECT_EQ(error_list[1].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[1].message, combinationError(first_combination, 0) << "unexpected instance type");

		EXPECT_EQ(error_list[2].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[2].message, combinationError(first_combination, 1) << "unexpected instance type");

		EXPECT_EQ(error_list[3].ptr, nlohmann::json::json_pointer{"/first"});
		EXPECT_MATCH(error_list[3].message, combinationError(first_combination, 2) << "instance is too short as per minLength:10");
	}
}